

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

int INT_CMwrite_raw_notify
              (CMConnection conn,FFSEncodeVector full_vec,FFSEncodeVector data_vec,long vec_count,
              size_t byte_count,attr_list attrs,int data_vec_stack,
              CMcompletion_notify_func notify_func,void *notify_client_data)

{
  undefined8 *puVar1;
  CMTransport_writev_func p_Var2;
  CMTransport_writev_complete_notify_func p_Var3;
  FFSEncodeVector pFVar4;
  FILE *pFVar5;
  uint uVar6;
  int iVar7;
  __pid_t _Var8;
  ulong uVar9;
  CMbuffer p_Var10;
  FFSEncodeVector pFVar11;
  pthread_t pVar12;
  char cVar13;
  uint uVar14;
  size_t *psVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  size_t sVar24;
  timespec ts;
  timespec local_40;
  
  if (conn->closed != 0) {
    return 0;
  }
  if (conn->failed != 0) {
    return 0;
  }
  if (conn->write_pending != 0) {
    wait_for_pending_write(conn);
  }
  cVar13 = '\0';
  if (vec_count < 1) {
    uVar20 = 0;
  }
  else {
    psVar15 = &full_vec->iov_len;
    uVar20 = 0;
    lVar17 = vec_count;
    do {
      uVar20 = uVar20 + *psVar15;
      psVar15 = psVar15 + 2;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
  }
  if (0 < vec_count && uVar20 < 0x2800) {
    uVar18 = 4;
    lVar17 = 0;
    cVar13 = '\0';
    do {
      if (uVar18 < full_vec[lVar17].iov_len) {
        do {
          cVar13 = cVar13 + *(char *)((long)full_vec[lVar17].iov_base + uVar18);
          uVar18 = uVar18 + 1;
        } while (full_vec[lVar17].iov_len != uVar18);
      }
      lVar17 = lVar17 + 1;
      uVar18 = 0;
    } while (lVar17 != vec_count);
  }
  *(char *)full_vec->iov_base = cVar13;
  if ((conn->do_non_blocking_write != 1) ||
     (p_Var2 = conn->trans->NBwritev_func, p_Var2 == (CMTransport_writev_func)0x0)) {
    p_Var3 = conn->trans->writev_complete_notify_func;
    if (notify_func == (CMcompletion_notify_func)0x0 ||
        p_Var3 == (CMTransport_writev_complete_notify_func)0x0) {
      iVar7 = (*conn->trans->writev_func)
                        (&CMstatic_trans_svcs,conn->transport_data,full_vec,vec_count,attrs);
      if (iVar7 == 0) {
        iVar21 = CMtrace_val[7];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar21 = CMtrace_init(conn->cm,CMFreeVerbose);
        }
        if (iVar21 != 0) {
          if (CMtrace_PID != 0) {
            pFVar5 = (FILE *)conn->cm->CMTrace_file;
            _Var8 = getpid();
            pVar12 = pthread_self();
            fprintf(pFVar5,"P%lxT%lx - ",(long)_Var8,pVar12);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_40);
            fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec)
            ;
          }
          fprintf((FILE *)conn->cm->CMTrace_file,
                  "Calling write failed connection failed with dereference %p\n",conn);
        }
        fflush((FILE *)conn->cm->CMTrace_file);
        INT_CMConnection_failed(conn);
      }
      lVar17 = (long)iVar7;
      if (notify_func != (CMcompletion_notify_func)0x0) {
        (*notify_func)(notify_client_data);
      }
    }
    else {
      iVar7 = (*p_Var3)(&CMstatic_trans_svcs,conn->transport_data,full_vec,vec_count,attrs,
                        notify_func,notify_client_data);
      lVar17 = (long)iVar7;
    }
    goto LAB_00120237;
  }
  uVar6 = (*p_Var2)(&CMstatic_trans_svcs,conn->transport_data,full_vec,vec_count,attrs);
  if ((int)uVar6 < 0) {
    iVar7 = CMtrace_val[7];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar7 = CMtrace_init(conn->cm,CMFreeVerbose);
    }
    if (iVar7 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = (FILE *)conn->cm->CMTrace_file;
        _Var8 = getpid();
        pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var8);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_40);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,
              "Calling write failed connection failed with dereference %p\n",conn);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    INT_CMConnection_failed(conn);
    p_Var10 = (conn->queued_data).buffer_to_free;
    if (p_Var10 != (CMbuffer)0x0) {
      cm_return_data_buf(conn->cm,p_Var10);
      (conn->queued_data).buffer_to_free = (CMbuffer)0x0;
    }
    conn->write_pending = 0;
    (*conn->trans->set_write_notify)(conn->trans,&CMstatic_trans_svcs,conn->transport_data,0);
    cm_wake_any_pending_write(conn);
  }
  lVar17 = vec_count;
  if ((long)(int)uVar6 < (long)uVar20) {
    uVar18 = 0;
    if (0 < (int)uVar6) {
      uVar18 = (ulong)uVar6;
    }
    if (data_vec_stack != 0) {
      data_vec = (FFSEncodeVector)copy_vector_to_FFSBuffer(conn->io_out_buffer,data_vec);
    }
    uVar23 = 0;
    uVar19 = (uint)vec_count;
    if ((int)uVar19 < 1) {
      lVar17 = 0;
    }
    else {
      uVar9 = (ulong)(uVar19 & 0x7fffffff);
      psVar15 = &full_vec->iov_len;
      lVar17 = 0;
      do {
        lVar17 = lVar17 + *psVar15;
        psVar15 = psVar15 + 2;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    uVar9 = full_vec->iov_len;
    pFVar11 = full_vec;
    uVar22 = uVar18;
    if (uVar9 < uVar18) {
      lVar16 = 0;
      do {
        uVar22 = uVar22 - uVar9;
        lVar16 = lVar16 + 1;
        uVar9 = pFVar11[1].iov_len;
        pFVar11 = pFVar11 + 1;
      } while (uVar9 < uVar22);
      uVar23 = (uint)lVar16;
    }
    else {
      lVar16 = 0;
    }
    pFVar11->iov_len = uVar9 - uVar22;
    pFVar11->iov_base = (void *)((long)pFVar11->iov_base + uVar22);
    if (data_vec != (FFSEncodeVector)0x0) {
      sVar24 = pFVar11->iov_len;
      puVar1 = (undefined8 *)
               ((long)&data_vec[lVar16].iov_base +
               ((ulong)(attrs == (attr_list)0x0) << 4 | 0xffffffffffffffe0));
      *puVar1 = pFVar11->iov_base;
      puVar1[1] = sVar24;
    }
    (conn->queued_data).buffer_to_free = (CMbuffer)0x0;
    if (uVar23 == 0) {
      if (0x20 < full_vec->iov_len) {
        __assert_fail("sizeof(conn->queued_data.rem_header) >= tmp_vec[0].iov_len",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                      ,0xbae,
                      "void queue_remaining_write(CMConnection, FFSEncodeVector, FFSEncodeVector, int, attr_list, size_t, int)"
                     );
      }
      memcpy(&conn->queued_data,full_vec->iov_base,full_vec->iov_len);
      sVar24 = full_vec->iov_len;
    }
    else {
      sVar24 = 0;
    }
    (conn->queued_data).rem_header_len = sVar24;
    if (uVar23 < 2 && attrs != (attr_list)0x0) {
      (conn->queued_data).rem_attr_base = (char *)full_vec[1].iov_base;
      (conn->queued_data).rem_attr_len = full_vec[1].iov_len;
      uVar23 = uVar23 + 1;
    }
    else {
      (conn->queued_data).rem_attr_len = 0;
    }
    pFVar11 = (FFSEncodeVector)0x0;
    uVar14 = ((attrs == (attr_list)0x0) - 2) + uVar23;
    if (uVar14 == 0xffffffff) {
LAB_00120122:
      (conn->queued_data).vector_data = pFVar11;
    }
    else {
      if (data_vec != (FFSEncodeVector)0x0) {
        (conn->queued_data).buffer_to_free = (CMbuffer)0x0;
        if ((int)uVar14 < 0) {
          uVar9 = 0;
        }
        else {
          uVar9 = (ulong)uVar14;
          iVar7 = CMtrace_val[3];
          if (conn->cm->CMTrace_file == (FILE *)0x0) {
            iVar7 = CMtrace_init(conn->cm,CMLowLevelVerbose);
          }
          if (iVar7 != 0) {
            if (CMtrace_PID != 0) {
              pFVar5 = (FILE *)conn->cm->CMTrace_file;
              _Var8 = getpid();
              pVar12 = pthread_self();
              fprintf(pFVar5,"P%lxT%lx - ",(long)_Var8,pVar12);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_40);
              fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,
                      local_40.tv_nsec);
            }
            fprintf((FILE *)conn->cm->CMTrace_file,"Removing from pbio_vec at offset %d\n",uVar9);
          }
          fflush((FILE *)conn->cm->CMTrace_file);
        }
        pFVar11 = (FFSEncodeVector)copy_all_to_FFSBuffer(conn->io_out_buffer,data_vec + uVar9);
        goto LAB_00120122;
      }
      sVar24 = lVar17 - ((conn->queued_data).rem_attr_len + uVar18 +
                        (conn->queued_data).rem_header_len);
      p_Var10 = cm_get_data_buf(conn->cm,sVar24 + 0x20);
      pFVar4 = (FFSEncodeVector)p_Var10->buffer;
      pFVar11 = pFVar4 + 2;
      iVar21 = uVar23 + (uVar23 == 0);
      iVar7 = 2;
      if (2 < iVar21) {
        iVar7 = iVar21;
      }
      pFVar4->iov_len = sVar24;
      pFVar4->iov_base = pFVar11;
      pFVar4[1].iov_base = (void *)0x0;
      pFVar4[1].iov_len = 0;
      (conn->queued_data).buffer_to_free = p_Var10;
      (conn->queued_data).vector_data = pFVar4;
      if (attrs == (attr_list)0x0) {
        iVar7 = iVar21;
      }
      if (iVar7 < (int)uVar19) {
        lVar17 = (long)(int)uVar19 - (long)iVar7;
        psVar15 = &full_vec[iVar7].iov_len;
        do {
          memcpy(pFVar11,((FFSEncodeVec *)(psVar15 + -1))->iov_base,*psVar15);
          pFVar11 = (FFSEncodeVector)((long)&pFVar11->iov_base + *psVar15);
          psVar15 = psVar15 + 2;
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
      }
    }
    (*conn->trans->set_write_notify)(conn->trans,&CMstatic_trans_svcs,conn->transport_data,1);
    conn->write_pending = 1;
    iVar7 = CMtrace_val[3];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar7 = CMtrace_init(conn->cm,CMLowLevelVerbose);
    }
    if (iVar7 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = (FILE *)conn->cm->CMTrace_file;
        _Var8 = getpid();
        pVar12 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var8,pVar12);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_40);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,"Partial write, queued %zd bytes\n",uVar20 - uVar18);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    lVar17 = 0;
  }
  if ((long)(int)uVar6 < (long)uVar20) {
    return 1;
  }
LAB_00120237:
  return (uint)(lVar17 == vec_count);
}

Assistant:

int
 INT_CMwrite_raw_notify(CMConnection conn, FFSEncodeVector full_vec, FFSEncodeVector data_vec,
			long vec_count, size_t byte_count, attr_list attrs, int data_vec_stack,
			CMcompletion_notify_func notify_func, void *notify_client_data)
 {
     size_t actual = 0;
     unsigned char checksum = 0;
     int i, j, start;
     size_t count = 0;
     size_t length = 0;
     if (conn->closed || conn->failed) return 0;

     if (conn->write_pending) {
	 wait_for_pending_write(conn);
     }
     for (i=0; i < vec_count; i++) {
	 length += full_vec[i].iov_len;
     }
     start = 4;
     if (length < 10240) {
	 /* do checksum for small messages */
	 for (i=0; i < vec_count; i++) {
	     count += full_vec[i].iov_len - start;
	     for (j=start; j< full_vec[i].iov_len; j++) {
		 checksum += ((unsigned char*)full_vec[i].iov_base)[j];
	     }
	     start = 0;
	 }
     }
     ((int*)full_vec[0].iov_base)[0] = 
	 (((int*)full_vec[0].iov_base)[0] & 0xffffff00) | (unsigned char) checksum;
     if ((conn->do_non_blocking_write == 1) && (conn->trans->NBwritev_func)) {
	 ssize_t actual_bytes;
	 actual_bytes = 
	     conn->trans->NBwritev_func(&CMstatic_trans_svcs, 
					     conn->transport_data, 
					     full_vec, vec_count, attrs);
	 if (actual_bytes < 0) {
	     CMtrace_out(conn->cm, CMFreeVerbose, "Calling write failed connection failed with dereference %p\n", conn);
	     INT_CMConnection_failed(conn);
	     if (conn->queued_data.buffer_to_free) {
		 cm_return_data_buf(conn->cm, conn->queued_data.buffer_to_free);
		 conn->queued_data.buffer_to_free = NULL;
	     }
	     conn->write_pending = 0;
	     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, 
					   conn->transport_data, 0);
	     cm_wake_any_pending_write(conn);
	 }
	 if (actual_bytes < (ssize_t)length) {
	     /* copy remaining and send it later */
	     if (actual_bytes < 0 ) actual_bytes = 0;
	     if (data_vec_stack) {
		 data_vec = copy_vector_to_FFSBuffer(conn->io_out_buffer, data_vec);
	     }
	     queue_remaining_write(conn, full_vec, data_vec, vec_count, 
				   attrs, actual_bytes, attrs != NULL);
	     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, conn->transport_data, 1);
	     conn->write_pending = 1;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, 
			 "Partial write, queued %zd bytes\n",
			 length - actual_bytes);
	     return 1;
	 }
	 actual = vec_count;  /* set actual for success */
     } else if (conn->trans->writev_complete_notify_func && notify_func) {
	 actual = conn->trans->writev_complete_notify_func(&CMstatic_trans_svcs, 
							   conn->transport_data, 
							   full_vec, vec_count, 
							   attrs, notify_func, notify_client_data);
     } else {
	 actual = conn->trans->writev_func(&CMstatic_trans_svcs, 
					   conn->transport_data, 
					   full_vec, vec_count, attrs);
	 if (actual <= 0) {
	     CMtrace_out(conn->cm, CMFreeVerbose, "Calling write failed connection failed with dereference %p\n", conn);
	     INT_CMConnection_failed(conn);
	 }
	 if (notify_func) {
	     (notify_func)(notify_client_data);
	 }
     }
     return actual == vec_count ? 1 : 0;
 }